

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::AsmJsByteCodeWriter::AsmReg17
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16)

{
  Data *this_00;
  bool bVar1;
  RegSlot local_8c;
  RegSlot local_88;
  RegSlot local_84;
  RegSlot local_80;
  RegSlot local_7c;
  RegSlot local_78;
  RegSlot local_74;
  RegSlot local_70;
  RegSlot local_6c;
  RegSlot local_68;
  RegSlot local_64;
  RegSlot local_60;
  RegSlot local_5c;
  RegSlot local_58;
  RegSlot local_54;
  RegSlot local_50;
  RegSlot local_4c;
  ByteCodeWriter *local_48;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  local_48 = &this->super_ByteCodeWriter;
  local_40 = R3;
  local_3c = R2;
  local_38 = R1;
  local_34 = R0;
  bVar1 = TryWriteAsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,R0,R1,R2,R3,R4,R5,R6,R7,R8,R9,R10,R11,R12,R13,R14,R15,R16);
  if (!bVar1) {
    bVar1 = TryWriteAsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      ((AsmJsByteCodeWriter *)local_48,op,local_34,local_38,local_3c,local_40,R4,R5,
                       R6,R7,R8,R9,R10,R11,R12,R13,R14,R15,R16);
    if (!bVar1) {
      local_8c = local_34;
      local_88 = local_38;
      local_84 = local_3c;
      local_80 = local_40;
      local_7c = R4;
      local_78 = R5;
      local_74 = R6;
      local_70 = R7;
      local_6c = R8;
      local_68 = R9;
      local_64 = R10;
      local_60 = R11;
      local_5c = R12;
      local_58 = R13;
      local_54 = R14;
      local_50 = R15;
      local_4c = R16;
      this_00 = &local_48->m_byteCodeData;
      ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)2>(this_00,op,local_48,false);
      ByteCodeWriter::Data::Write(this_00,&local_8c,0x44);
    }
  }
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmReg17(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
                                                       RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16)
    {
        MULTISIZE_LAYOUT_WRITE(AsmReg17, op, R0, R1, R2, R3, R4, R5, R6, R7, R8, R9, R10, R11, R12, R13, R14, R15, R16);
    }